

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

vector<char8_t,_std::allocator<char8_t>_> *
make_word<char8_t,std::vector<char8_t,std::allocator<char8_t>>>
          (vector<char8_t,_std::allocator<char8_t>_> *__return_storage_ptr__,size_t length,
          char8_t delim)

{
  initializer_list<char8_t> __l;
  allocator<char8_t> local_52;
  char8_t local_51;
  iterator local_50;
  size_type local_48;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_40;
  char8_t local_19;
  size_t sStack_18;
  char8_t delim_local;
  size_t length_local;
  
  local_50 = &local_51;
  local_48 = 1;
  local_51 = delim;
  local_19 = delim;
  sStack_18 = length;
  length_local = (size_t)__return_storage_ptr__;
  std::allocator<char8_t>::allocator(&local_52);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::__cxx11::u8string::u8string((u8string *)&local_40,__l,&local_52);
  make_word<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (__return_storage_ptr__,&local_40,sStack_18);
  std::__cxx11::u8string::~u8string((u8string *)&local_40);
  std::allocator<char8_t>::~allocator(&local_52);
  return __return_storage_ptr__;
}

Assistant:

ResultT make_word(size_t length = 8, T delim = default_delim<T>) {
	return make_word<T, ResultT>(std::basic_string<T>{ delim }, length);
}